

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kfpu.c
# Opt level: O0

floatx80 load_pack_float80(uint32 ea)

{
  byte bVar1;
  char **ppcVar2;
  floatx80 fVar3;
  char **local_c0;
  char *ch;
  char str [128];
  double local_30;
  double tmp;
  uint32 dw3;
  uint32 dw2;
  uint32 dw1;
  uint32 ea_local;
  floatx80 result;
  
  dw2 = ea;
  dw3 = m68ki_read_32_fc(ea,m68ki_cpu.s_flag | m68ki_address_space);
  tmp._4_4_ = m68ki_read_32_fc(dw2 + 4,m68ki_cpu.s_flag | m68ki_address_space);
  tmp._0_4_ = m68ki_read_32_fc(dw2 + 8,m68ki_cpu.s_flag | m68ki_address_space);
  local_c0 = &ch;
  if ((dw3 & 0x80000000) != 0) {
    local_c0 = (char **)((long)&ch + 1);
    ch._0_1_ = 0x2d;
  }
  *(byte *)local_c0 = ((byte)dw3 & 0xf) + 0x30;
  *(char *)((long)local_c0 + 1) = '.';
  bVar1 = (byte)(tmp._4_4_ >> 0x18);
  *(byte *)((long)local_c0 + 2) = (bVar1 >> 4) + 0x30;
  *(byte *)((long)local_c0 + 3) = (bVar1 & 0xf) + 0x30;
  *(byte *)((long)local_c0 + 4) = ((byte)(tmp._4_4_ >> 0x14) & 0xf) + 0x30;
  *(byte *)((long)local_c0 + 5) = ((byte)(tmp._4_4_ >> 0x10) & 0xf) + 0x30;
  *(byte *)((long)local_c0 + 6) = ((byte)(tmp._4_4_ >> 0xc) & 0xf) + 0x30;
  *(byte *)((long)local_c0 + 7) = ((byte)(tmp._4_4_ >> 8) & 0xf) + 0x30;
  *(byte *)(local_c0 + 1) = ((byte)(tmp._4_4_ >> 4) & 0xf) + 0x30;
  *(byte *)((long)local_c0 + 9) = ((byte)tmp._4_4_ & 0xf) + 0x30;
  bVar1 = (byte)(tmp._0_4_ >> 0x18);
  *(byte *)((long)local_c0 + 10) = (bVar1 >> 4) + 0x30;
  *(byte *)((long)local_c0 + 0xb) = (bVar1 & 0xf) + 0x30;
  *(byte *)((long)local_c0 + 0xc) = ((byte)(tmp._0_4_ >> 0x14) & 0xf) + 0x30;
  *(byte *)((long)local_c0 + 0xd) = ((byte)(tmp._0_4_ >> 0x10) & 0xf) + 0x30;
  *(byte *)((long)local_c0 + 0xe) = ((byte)(tmp._0_4_ >> 0xc) & 0xf) + 0x30;
  *(byte *)((long)local_c0 + 0xf) = ((byte)(tmp._0_4_ >> 8) & 0xf) + 0x30;
  *(byte *)(local_c0 + 2) = ((byte)(tmp._0_4_ >> 4) & 0xf) + 0x30;
  *(byte *)((long)local_c0 + 0x11) = ((byte)tmp._0_4_ & 0xf) + 0x30;
  *(char *)((long)local_c0 + 0x12) = 'E';
  ppcVar2 = (char **)((long)local_c0 + 0x13);
  if ((dw3 & 0x40000000) != 0) {
    *(byte *)((long)local_c0 + 0x13) = 0x2d;
    ppcVar2 = (char **)((long)local_c0 + 0x14);
  }
  local_c0 = ppcVar2;
  *(byte *)local_c0 = dw3._3_1_ & 0xf | 0x30;
  *(byte *)((long)local_c0 + 1) = (byte)(dw3 >> 0x14) & 0xf | 0x30;
  *(byte *)((long)local_c0 + 2) = dw3._2_1_ & 0xf | 0x30;
  *(byte *)((long)local_c0 + 3) = 0;
  __isoc99_sscanf(&ch,"%le",&local_30);
  fVar3 = double_to_fx80(local_30);
  return fVar3;
}

Assistant:

static inline floatx80 load_pack_float80(uint32 ea)
{
	uint32 dw1, dw2, dw3;
	floatx80 result;
	double tmp;
	char str[128], *ch;

	dw1 = m68ki_read_32(ea);
	dw2 = m68ki_read_32(ea+4);
	dw3 = m68ki_read_32(ea+8);

	ch = &str[0];
	if (dw1 & 0x80000000)	// mantissa sign
	{
		*ch++ = '-';
	}
	*ch++ = (char)((dw1 & 0xf) + '0');
	*ch++ = '.';
	*ch++ = (char)(((dw2 >> 28) & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 24) & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 20) & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 16) & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 12) & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 8)  & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 4)  & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 0)  & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 28) & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 24) & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 20) & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 16) & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 12) & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 8)  & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 4)  & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 0)  & 0xf) + '0');
	*ch++ = 'E';
	if (dw1 & 0x40000000)	// exponent sign
	{
		*ch++ = '-';
	}
	*ch++ = (char)(((dw1 >> 24) & 0xf) + '0');
	*ch++ = (char)(((dw1 >> 20) & 0xf) + '0');
	*ch++ = (char)(((dw1 >> 16) & 0xf) + '0');
	*ch = '\0';

	sscanf(str, "%le", &tmp);

	result = double_to_fx80(tmp);

	return result;
}